

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int push_signature_algorithms(ptls_verify_certificate_t *vc,ptls_buffer_t *sendbuf)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  ptls_buffer_t *in_RSI;
  long in_RDI;
  size_t body_size;
  uint16_t _v;
  uint16_t *p;
  size_t body_start;
  size_t capacity;
  int ret;
  size_t in_stack_ffffffffffffffa8;
  uint16_t *len;
  void *src;
  ptls_buffer_t *buf;
  uint16_t *local_30;
  long local_20;
  int local_14;
  
  local_20 = 2;
  src = (void *)0x2;
  buf = in_RSI;
  local_14 = ptls_buffer__do_pushv(in_RSI,(void *)0x2,in_stack_ffffffffffffffa8);
  if (local_14 == 0) {
    sVar1 = in_RSI->off;
    if (in_RDI == 0) {
      len = push_signature_algorithms::default_algos;
      local_30 = len;
    }
    else {
      len = *(uint16_t **)(in_RDI + 8);
      local_30 = len;
    }
    for (; *local_30 != 0xffff; local_30 = local_30 + 1) {
      iVar3 = ptls_buffer__do_pushv(buf,src,(size_t)len);
      if (iVar3 != 0) {
        return iVar3;
      }
    }
    sVar2 = in_RSI->off;
    for (; local_20 != 0; local_20 = local_20 + -1) {
      in_RSI->base[sVar1 - local_20] =
           (uint8_t)(sVar2 - sVar1 >> (((char)local_20 + -1) * '\b' & 0x3fU));
    }
    local_14 = 0;
  }
  return local_14;
}

Assistant:

static int push_signature_algorithms(ptls_verify_certificate_t *vc, ptls_buffer_t *sendbuf)
{
    /* The list sent when verify callback is not registered */
    static const uint16_t default_algos[] = {PTLS_SIGNATURE_RSA_PSS_RSAE_SHA256, PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256,
                                             PTLS_SIGNATURE_RSA_PKCS1_SHA256, PTLS_SIGNATURE_RSA_PKCS1_SHA1, UINT16_MAX};
    int ret;

    ptls_buffer_push_block(sendbuf, 2, {
        for (const uint16_t *p = vc != NULL ? vc->algos : default_algos; *p != UINT16_MAX; ++p)
            ptls_buffer_push16(sendbuf, *p);
    });

    ret = 0;
Exit:
    return ret;
}